

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetMassTimes(void *arkode_mem,ARKLsMassTimesSetupFn mtsetup,ARKLsMassTimesVecFn mtimes,
                      void *mtimes_data)

{
  int iVar1;
  ARKTimestepPrintMem in_RCX;
  ARKTimestepFree in_RDX;
  ARKTimestepReset in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x6e8,"ARKodeSetMassTimes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_massmatrix == 0) {
    arkProcessError(in_RDI,-0x30,0x6f1,"ARKodeSetMassTimes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not support non-identity mass matrices");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffc8,
                                  (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8);
    if (local_4 == 0) {
      if (in_RDX == (ARKTimestepFree)0x0) {
        arkProcessError(in_RDI,-3,0x6fd,"ARKodeSetMassTimes",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                        ,"non-NULL mtimes function must be supplied");
        local_4 = -3;
      }
      else if (*(long *)(*(long *)(in_stack_ffffffffffffffc8->step_init + 8) + 0x10) == 0) {
        arkProcessError(in_RDI,-3,0x705,"ARKodeSetMassTimes",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                        ,"SUNLinearSolver object does not support user-supplied ATimes routine");
        local_4 = -3;
      }
      else {
        in_stack_ffffffffffffffc8->step_reset = in_RSI;
        in_stack_ffffffffffffffc8->step_free = in_RDX;
        in_stack_ffffffffffffffc8->step_printmem = in_RCX;
        iVar1 = SUNLinSolSetATimes(in_stack_ffffffffffffffc8->step_init,in_RDI,arkLsMTimes);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          arkProcessError(in_RDI,-0xc,0x714,"ARKodeSetMassTimes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                          ,"Error in calling SUNLinSolSetATimes");
          local_4 = -0xc;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetMassTimes(void* arkode_mem, ARKLsMassTimesSetupFn mtsetup,
                       ARKLsMassTimesVecFn mtimes, void* mtimes_data)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if mtimes function is unusable */
  if (mtimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "non-NULL mtimes function must be supplied");
    return (ARKLS_ILL_INPUT);
  }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (ARKLS_ILL_INPUT);
  }

  /* store pointers for user-supplied routines and data structure
     in ARKLs interface */
  arkls_mem->mtsetup = mtsetup;
  arkls_mem->mtimes  = mtimes;
  arkls_mem->mt_data = mtimes_data;

  /* notify linear solver to call ARKLs interface routine */
  retval = SUNLinSolSetATimes(arkls_mem->LS, ark_mem, arkLsMTimes);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetATimes");
    return (ARKLS_SUNLS_FAIL);
  }

  return (ARKLS_SUCCESS);
}